

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O3

ip4_flow_key om::net::ip4_flow_key::from_ip4_bytes(uchar *buf_)

{
  byte bVar1;
  in_addr_t iVar2;
  ulong uVar3;
  ip4_flow_key iVar4;
  ip4_header ip;
  ip4_header local_40;
  
  ip4_header::ip4_header(&local_40,buf_);
  iVar2 = ((local_40._ip)->ip_src).s_addr;
  bVar1 = (local_40._ip)->ip_p;
  uVar3 = (ulong)bVar1 << 0x20;
  if ((bVar1 == 0x11) || (bVar1 == 6)) {
    uVar3 = (ulong)CONCAT14(bVar1,CONCAT22(*(ushort *)(buf_ + 0x16) << 8 |
                                           *(ushort *)(buf_ + 0x16) >> 8,
                                           *(ushort *)(buf_ + 0x14) << 8 |
                                           *(ushort *)(buf_ + 0x14) >> 8));
  }
  local_40.super_packet_header._vptr_packet_header = (_func_int **)&PTR__packet_header_001adb98;
  if ((local_40.super_packet_header._alloc == true) &&
     (local_40.super_packet_header._buf != (uchar *)0x0)) {
    operator_delete__(local_40.super_packet_header._buf);
  }
  iVar4._ip_dst._addr = iVar2;
  iVar4._ip_src._addr = iVar2;
  iVar4._tp_src = (short)uVar3;
  iVar4._tp_dst = (short)(uVar3 >> 0x10);
  iVar4._ip_proto = (char)(uVar3 >> 0x20);
  iVar4._13_3_ = (int3)(uVar3 >> 0x28);
  return iVar4;
}

Assistant:

static ip4_flow_key from_ip4_bytes(const unsigned char* buf_)
			{
				ip4_flow_key flow_key;
				ip4_header ip(buf_);

				flow_key._ip_src   = ip.src_addr();
				flow_key._ip_dst   = ip.src_addr();
				flow_key._ip_proto = ip.proto();

				if (ip.proto() == 6) {
					om::net::tcp_header tcp(buf_ + 20);
					flow_key._tp_src = tcp.src_port();
					flow_key._tp_dst = tcp.dest_port();
				} else if (ip.proto() == 17) {
					om::net::udp_header udp(buf_ + 20);
					flow_key._tp_src = udp.src_port();
					flow_key._tp_dst = udp.dest_port();
				}

				return flow_key;
			}